

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-ft-raster.c
# Opt level: O0

void gray_render_line(PWorker worker,TPos to_x,TPos to_y)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long ey;
  ulong y1;
  ulong y2;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  TCoord local_d0;
  TCoord local_c0;
  long local_b8;
  TCoord rem;
  TCoord lift;
  TPos max_ey1;
  TPos area;
  TCoord two_fx;
  TCoord ex;
  int incr;
  TPos x2;
  TPos x;
  TPos dy;
  TPos dx;
  TPos p;
  TCoord mod;
  TCoord delta;
  TCoord first;
  TCoord fy2;
  TCoord fy1;
  TCoord ey2;
  TCoord ey1;
  TPos to_y_local;
  TPos to_x_local;
  PWorker worker_local;
  
  lVar3 = worker->y >> 8;
  ey = to_y >> 8;
  if (((lVar3 < worker->max_ey) || (ey < worker->max_ey)) &&
     ((worker->min_ey <= lVar3 || (worker->min_ey <= ey)))) {
    y1 = worker->y & 0xff;
    y2 = to_y & 0xff;
    if (lVar3 == ey) {
      gray_render_scanline(worker,lVar3,worker->x,y1,to_x,y2);
    }
    else {
      lVar4 = to_x - worker->x;
      x = to_y - worker->y;
      if (lVar4 == 0) {
        lVar4 = worker->x >> 8;
        lVar5 = (worker->x & 0xffU) * 2;
        if (x < 1) {
          delta = 0;
        }
        else {
          delta = 0x100;
        }
        worker->area = lVar5 * (delta - y1) + worker->area;
        worker->cover = worker->cover + (int)(delta - y1);
        lVar6 = delta * 2 + -0x100;
        lVar7 = lVar5 * lVar6;
        lVar8 = worker->count_ey + worker->min_ey;
        iVar2 = (int)lVar6;
        if (x < 0) {
          if (lVar8 < lVar3) {
            local_c0 = ey;
            if (ey < lVar8) {
              local_c0 = lVar8;
            }
            ey2 = local_c0;
            gray_set_cell(worker,lVar4,local_c0);
          }
          else {
            ey2 = lVar3 + -1;
            gray_set_cell(worker,lVar4,ey2);
          }
          while( true ) {
            bVar1 = false;
            if (ey < ey2) {
              bVar1 = worker->min_ey <= ey2;
            }
            if (!bVar1) break;
            worker->area = lVar7 + worker->area;
            worker->cover = worker->cover + iVar2;
            ey2 = ey2 + -1;
            gray_set_cell(worker,lVar4,ey2);
          }
          if (ey2 != ey) {
            gray_set_cell(worker,lVar4,ey);
          }
        }
        else {
          if (lVar3 < worker->min_ey) {
            local_d0 = ey;
            if (worker->min_ey < ey) {
              local_d0 = worker->min_ey;
            }
            ey2 = local_d0;
            gray_set_cell(worker,lVar4,local_d0);
          }
          else {
            ey2 = lVar3 + 1;
            gray_set_cell(worker,lVar4,ey2);
          }
          while (ey2 < ey && ey2 < lVar8) {
            worker->area = lVar7 + worker->area;
            worker->cover = worker->cover + iVar2;
            ey2 = ey2 + 1;
            gray_set_cell(worker,lVar4,ey2);
          }
          if (ey2 != ey) {
            gray_set_cell(worker,lVar4,ey);
          }
        }
        iVar2 = (int)y2 + -0x100 + (int)delta;
        worker->area = lVar5 * iVar2 + worker->area;
        worker->cover = worker->cover + iVar2;
      }
      else {
        if (x < 1) {
          delta = 0;
          ex._4_4_ = -1;
          x = -x;
          uVar9 = y1;
        }
        else {
          delta = 0x100;
          ex._4_4_ = 1;
          uVar9 = 0x100 - y1;
        }
        dx = uVar9 * lVar4;
        mod = dx / x;
        p = dx % x;
        if (p < 0) {
          mod = mod + -1;
          p = x + p;
        }
        x2 = worker->x + mod;
        gray_render_scanline(worker,lVar3,worker->x,y1,x2,delta);
        ey2 = ex._4_4_ + lVar3;
        gray_set_cell(worker,x2 >> 8,ey2);
        if (ey2 != ey) {
          rem = (lVar4 * 0x100) / x;
          local_b8 = (lVar4 * 0x100) % x;
          if (local_b8 < 0) {
            rem = rem + -1;
            local_b8 = x + local_b8;
          }
          do {
            mod = rem;
            p = local_b8 + p;
            if (x <= p) {
              p = p - x;
              mod = rem + 1;
            }
            lVar3 = x2 + mod;
            gray_render_scanline(worker,ey2,x2,0x100 - delta,lVar3,delta);
            ey2 = ex._4_4_ + ey2;
            gray_set_cell(worker,lVar3 >> 8,ey2);
            x2 = lVar3;
          } while (ey2 != ey);
        }
        gray_render_scanline(worker,ey2,x2,0x100 - delta,to_x,y2);
      }
    }
  }
  worker->x = to_x;
  worker->y = to_y;
  return;
}

Assistant:

static void
  gray_render_line( RAS_ARG_ TPos  to_x,
                             TPos  to_y )
  {
    TCoord  ey1, ey2, fy1, fy2, first, delta, mod;
    TPos    p, dx, dy, x, x2;
    int     incr;

    ey1 = TRUNC( ras.y );
    ey2 = TRUNC( to_y );     /* if (ey2 >= ras.max_ey) ey2 = ras.max_ey-1; */

    /* perform vertical clipping */
    if ( ( ey1 >= ras.max_ey && ey2 >= ras.max_ey ) ||
         ( ey1 <  ras.min_ey && ey2 <  ras.min_ey ) )
      goto End;

    fy1 = FRACT( ras.y );
    fy2 = FRACT( to_y );

    /* everything is on a single scanline */
    if ( ey1 == ey2 )
    {
      gray_render_scanline( RAS_VAR_ ey1, ras.x, fy1, to_x, fy2 );
      goto End;
    }

    dx = to_x - ras.x;
    dy = to_y - ras.y;

    /* vertical line - avoid calling gray_render_scanline */
    if ( dx == 0 )
    {
      TCoord  ex     = TRUNC( ras.x );
      TCoord  two_fx = FRACT( ras.x ) << 1;
      TPos    area, max_ey1;


      if ( dy > 0)
      {
        first = ONE_PIXEL;
      }
      else
      {
        first = 0;
      }

      delta      = first - fy1;
      ras.area  += (TArea)two_fx * delta;
      ras.cover += delta;

      delta = first + first - ONE_PIXEL;
      area  = (TArea)two_fx * delta;
      max_ey1 = ras.count_ey + ras.min_ey;
      if (dy < 0) {
        if (ey1 > max_ey1) {
          ey1 = (max_ey1 > ey2) ? max_ey1 : ey2;
          gray_set_cell( &ras, ex, ey1 );
        } else {
          ey1--;
          gray_set_cell( &ras, ex, ey1 );
        }
        while ( ey1 > ey2 && ey1 >= ras.min_ey)
        {
          ras.area  += area;
          ras.cover += delta;
          ey1--;

          gray_set_cell( &ras, ex, ey1 );
        }
        if (ey1 != ey2) {
          ey1 = ey2;
          gray_set_cell( &ras, ex, ey1 );
        }
      } else {
        if (ey1 < ras.min_ey) {
          ey1 = (ras.min_ey < ey2) ? ras.min_ey : ey2;
          gray_set_cell( &ras, ex, ey1 );
        } else {
          ey1++;
          gray_set_cell( &ras, ex, ey1 );
        }
        while ( ey1 < ey2 && ey1 < max_ey1)
        {
          ras.area  += area;
          ras.cover += delta;
          ey1++;

          gray_set_cell( &ras, ex, ey1 );
        }
        if (ey1 != ey2) {
          ey1 = ey2;
          gray_set_cell( &ras, ex, ey1 );
        }
      }

      delta      = (int)( fy2 - ONE_PIXEL + first );
      ras.area  += (TArea)two_fx * delta;
      ras.cover += delta;

      goto End;
    }

    /* ok, we have to render several scanlines */
    if ( dy > 0)
    {
      p     = ( ONE_PIXEL - fy1 ) * dx;
      first = ONE_PIXEL;
      incr  = 1;
    }
    else
    {
      p     = fy1 * dx;
      first = 0;
      incr  = -1;
      dy    = -dy;
    }

    /* the fractional part of x-delta is mod/dy. It is essential to */
    /* keep track of its accumulation for accurate rendering.       */
    PVG_FT_DIV_MOD( TCoord, p, dy, delta, mod );

    x = ras.x + delta;
    gray_render_scanline( RAS_VAR_ ey1, ras.x, fy1, x, (TCoord)first );

    ey1 += incr;
    gray_set_cell( RAS_VAR_ TRUNC( x ), ey1 );

    if ( ey1 != ey2 )
    {
      TCoord  lift, rem;


      p    = ONE_PIXEL * dx;
      PVG_FT_DIV_MOD( TCoord, p, dy, lift, rem );

      do
      {
        delta = lift;
        mod  += rem;
        if ( mod >= (TCoord)dy )
        {
          mod -= (TCoord)dy;
          delta++;
        }

        x2 = x + delta;
        gray_render_scanline( RAS_VAR_ ey1,
                                       x, ONE_PIXEL - first,
                                       x2, first );
        x = x2;

        ey1 += incr;
        gray_set_cell( RAS_VAR_ TRUNC( x ), ey1 );
      } while ( ey1 != ey2 );
    }

    gray_render_scanline( RAS_VAR_ ey1,
                                   x, ONE_PIXEL - first,
                                   to_x, fy2 );

  End:
    ras.x       = to_x;
    ras.y       = to_y;
  }